

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFactory.h
# Opt level: O0

void __thiscall
MinVR::VRFactory::registerItemType<MinVR::VRDisplayNode,MinVR::VROffAxisProjectionNode>
          (VRFactory *this,string *typeName)

{
  VRFactory *in_RSI;
  string *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  operator_new(0x28);
  VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VROffAxisProjectionNode>::VRConcreteItemFactory
            ((VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VROffAxisProjectionNode> *)in_RSI,
             in_RDI);
  addSubFactory(in_RSI,(VRItemFactory *)in_RDI);
  return;
}

Assistant:

void VRFactory::registerItemType(const std::string typeName) {

  _registeredTypes.push_back(typeName);

  addSubFactory(new VRConcreteItemFactory<ParentType, T>(typeName));
}